

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

int DataVector::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined7 uVar1;
  const_reference cVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong *in_RCX;
  vector<DataPoint,_std::allocator<DataPoint>_> *in_RDX;
  vector<bool,_std::allocator<bool>_> *in_R8;
  ulong *in_R9;
  ulong local_48;
  size_type i;
  size_type j;
  size_type *numMask_local;
  vector<bool,_std::allocator<bool>_> *mask_local;
  size_type *numDst_local;
  DataVector *dst_local;
  size_type *numSrc_local;
  DataVector *src_local;
  
  deactivate((DataVector *)in_RDX);
  i = 0;
  for (local_48 = 0; local_48 < *(ulong *)src; local_48 = local_48 + 1) {
    if ((*in_R9 <= local_48) ||
       (cVar2 = std::vector<bool,_std::allocator<bool>_>::at(in_R8,local_48), cVar2)) {
      if (i < *in_RCX) {
        pvVar3 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                           ((vector<DataPoint,_std::allocator<DataPoint>_> *)dst,local_48);
        pvVar4 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at(in_RDX,i);
        uVar1 = *(undefined7 *)&pvVar3->field_0x1;
        pvVar4->active = pvVar3->active;
        *(undefined7 *)&pvVar4->field_0x1 = uVar1;
        pvVar4->value = pvVar3->value;
      }
      else {
        pvVar3 = std::vector<DataPoint,_std::allocator<DataPoint>_>::at
                           ((vector<DataPoint,_std::allocator<DataPoint>_> *)dst,local_48);
        std::vector<DataPoint,_std::allocator<DataPoint>_>::push_back(in_RDX,pvVar3);
      }
      i = i + 1;
    }
  }
  return (int)local_48;
}

Assistant:

static
    void copy(DataVector const & src,
              DataVector::size_type const & numSrc,
              DataVector & dst,
              DataVector::size_type const & numDst,
              std::vector<bool> const & mask,
              DataVector::size_type const & numMask)
    {

        // Deactivate all destination value by default
        dst.deactivate();

        // Copy elements
        DataVector::size_type j = 0;
        for (DataVector::size_type i = 0; i < numSrc; i++)
        {
            // Check if current value is masked out
            if (i < numMask)
            {
                if (!mask.at(i)) continue;
            }

            // Add or set next value
            if (j >= numDst)
            {
                dst.push_back(src.at(i));
            }
            else
            {
                dst.at(j) = src.at(i);
            }
            j++;
        }

    }